

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void cftmdl(int n,int l,double *a,double *w)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  int local_88;
  
  iVar4 = l * 4;
  if (0 < l) {
    uVar3 = (ulong)(uint)l;
    uVar11 = 0;
    do {
      dVar18 = a[uVar11] + a[uVar3 + uVar11];
      dVar19 = a[uVar11 + 1] + a[uVar3 + uVar11 + 1];
      dVar15 = a[uVar11] - a[uVar3 + uVar11];
      dVar14 = a[uVar11 + 1] - a[uVar3 + uVar11 + 1];
      dVar20 = a[uVar3 * 2 + uVar11] + a[uVar3 * 3 + uVar11];
      dVar22 = a[uVar3 * 2 + uVar11 + 1] + a[uVar3 * 3 + uVar11 + 1];
      dVar16 = a[uVar3 * 2 + uVar11] - a[uVar3 * 3 + uVar11];
      dVar17 = a[uVar3 * 2 + uVar11 + 1] - a[uVar3 * 3 + uVar11 + 1];
      a[uVar11] = dVar18 + dVar20;
      a[uVar11 + 1] = dVar19 + dVar22;
      a[uVar3 * 2 + uVar11] = dVar18 - dVar20;
      a[uVar3 * 2 + uVar11 + 1] = dVar19 - dVar22;
      a[uVar3 + uVar11] = dVar15 - dVar17;
      a[uVar3 + uVar11 + 1] = dVar14 + dVar16;
      a[uVar3 * 3 + uVar11] = dVar17 + dVar15;
      a[uVar3 * 3 + uVar11 + 1] = dVar14 - dVar16;
      uVar11 = uVar11 + 2;
    } while (uVar11 < uVar3);
  }
  if (iVar4 < l * 5) {
    dVar14 = w[2];
    lVar6 = (long)iVar4;
    lVar12 = (long)l;
    do {
      dVar19 = a[lVar6] + a[lVar12 + lVar6];
      dVar20 = a[lVar6 + 1] + a[lVar12 + lVar6 + 1];
      dVar16 = a[lVar6] - a[lVar12 + lVar6];
      dVar15 = a[lVar6 + 1] - a[lVar12 + lVar6 + 1];
      dVar22 = a[lVar12 * 2 + lVar6] + a[lVar12 * 3 + lVar6];
      dVar23 = a[lVar12 * 2 + lVar6 + 1] + a[lVar12 * 3 + lVar6 + 1];
      dVar17 = a[lVar12 * 2 + lVar6] - a[lVar12 * 3 + lVar6];
      dVar18 = a[lVar12 * 2 + lVar6 + 1] - a[lVar12 * 3 + lVar6 + 1];
      a[lVar6] = dVar19 + dVar22;
      a[lVar6 + 1] = dVar20 + dVar23;
      a[lVar12 * 2 + lVar6] = dVar23 - dVar20;
      a[lVar12 * 2 + lVar6 + 1] = dVar19 - dVar22;
      dVar19 = dVar16 - dVar18;
      dVar20 = dVar15 + dVar17;
      a[lVar12 + lVar6] = (dVar19 - dVar20) * dVar14;
      a[lVar12 + lVar6 + 1] = (dVar20 + dVar19) * dVar14;
      dVar18 = dVar18 + dVar16;
      dVar17 = dVar17 - dVar15;
      a[lVar12 * 3 + lVar6] = (dVar17 - dVar18) * dVar14;
      a[lVar12 * 3 + lVar6 + 1] = (dVar17 + dVar18) * dVar14;
      lVar6 = lVar6 + 2;
    } while (lVar6 < l * 5);
  }
  iVar5 = l * 8;
  if (iVar5 < n) {
    lVar9 = (long)iVar5;
    local_88 = l * 0xc;
    lVar7 = (long)l;
    lVar6 = lVar7 + lVar9;
    lVar10 = 0;
    lVar12 = lVar9;
    lVar13 = 0;
    do {
      lVar1 = lVar13 + 2;
      dVar14 = w[lVar13 + 2];
      dVar15 = w[lVar13 + 3];
      if (0 < l) {
        dVar16 = w[lVar1 * 2];
        dVar17 = w[lVar1 * 2 + 1];
        dVar19 = dVar16 - (dVar15 + dVar15) * dVar17;
        dVar18 = (dVar15 + dVar15) * dVar16 - dVar17;
        lVar8 = lVar10;
        do {
          dVar27 = a[lVar9 + lVar8] + a[lVar6 + lVar8];
          dVar23 = a[lVar9 + lVar8 + 1] + a[lVar6 + lVar8 + 1];
          dVar25 = a[lVar9 + lVar8] - a[lVar6 + lVar8];
          dVar20 = a[lVar9 + lVar8 + 1] - a[lVar6 + lVar8 + 1];
          dVar26 = a[lVar7 * 2 + lVar9 + lVar8] + a[lVar7 * 3 + lVar9 + lVar8];
          dVar21 = a[lVar7 * 2 + lVar9 + lVar8] - a[lVar7 * 3 + lVar9 + lVar8];
          dVar22 = a[lVar7 * 2 + lVar9 + lVar8 + 1] + a[lVar7 * 3 + lVar9 + lVar8 + 1];
          dVar24 = a[lVar7 * 2 + lVar9 + lVar8 + 1] - a[lVar7 * 3 + lVar9 + lVar8 + 1];
          a[lVar9 + lVar8] = dVar27 + dVar26;
          a[lVar9 + lVar8 + 1] = dVar23 + dVar22;
          dVar27 = dVar27 - dVar26;
          dVar23 = dVar23 - dVar22;
          a[lVar7 * 2 + lVar9 + lVar8] = dVar14 * dVar27 + dVar23 * -dVar15;
          a[lVar7 * 2 + lVar9 + lVar8 + 1] = dVar27 * dVar15 + dVar14 * dVar23;
          dVar22 = dVar25 - dVar24;
          dVar23 = dVar20 + dVar21;
          a[lVar6 + lVar8] = dVar16 * dVar22 + dVar23 * -dVar17;
          a[lVar6 + lVar8 + 1] = dVar22 * dVar17 + dVar16 * dVar23;
          dVar24 = dVar24 + dVar25;
          dVar20 = dVar20 - dVar21;
          a[lVar7 * 3 + lVar9 + lVar8] = dVar19 * dVar24 + dVar20 * -dVar18;
          a[lVar7 * 3 + lVar9 + lVar8 + 1] = dVar24 * dVar18 + dVar19 * dVar20;
          lVar2 = lVar9 + lVar8;
          lVar8 = lVar8 + 2;
        } while (lVar2 + 2 < lVar12 + lVar7);
      }
      if (0 < l) {
        lVar8 = (long)local_88;
        dVar16 = w[lVar13 * 2 + 6];
        dVar17 = w[lVar13 * 2 + 7];
        dVar19 = dVar16 - (dVar14 + dVar14) * dVar17;
        dVar18 = (dVar14 + dVar14) * dVar16 - dVar17;
        do {
          dVar27 = a[lVar8] + a[lVar7 + lVar8];
          dVar20 = a[lVar8 + 1] + a[lVar7 + lVar8 + 1];
          dVar25 = a[lVar8] - a[lVar7 + lVar8];
          dVar21 = a[lVar8 + 1] - a[lVar7 + lVar8 + 1];
          dVar26 = a[lVar7 * 2 + lVar8] + a[lVar7 * 3 + lVar8];
          dVar23 = a[lVar7 * 2 + lVar8] - a[lVar7 * 3 + lVar8];
          dVar22 = a[lVar7 * 2 + lVar8 + 1] + a[lVar7 * 3 + lVar8 + 1];
          dVar24 = a[lVar7 * 2 + lVar8 + 1] - a[lVar7 * 3 + lVar8 + 1];
          a[lVar8] = dVar27 + dVar26;
          a[lVar8 + 1] = dVar20 + dVar22;
          dVar27 = dVar27 - dVar26;
          dVar20 = dVar20 - dVar22;
          a[lVar7 * 2 + lVar8] = -dVar15 * dVar27 + dVar20 * -dVar14;
          a[lVar7 * 2 + lVar8 + 1] = dVar27 * dVar14 + -dVar15 * dVar20;
          dVar20 = dVar25 - dVar24;
          dVar22 = dVar21 + dVar23;
          a[lVar7 + lVar8] = dVar16 * dVar20 + dVar22 * -dVar17;
          a[lVar7 + lVar8 + 1] = dVar20 * dVar17 + dVar16 * dVar22;
          dVar24 = dVar24 + dVar25;
          dVar21 = dVar21 - dVar23;
          a[lVar7 * 3 + lVar8] = dVar19 * dVar24 + dVar21 * -dVar18;
          a[lVar7 * 3 + lVar8 + 1] = dVar24 * dVar18 + dVar19 * dVar21;
          lVar8 = lVar8 + 2;
        } while (lVar8 < lVar12 + iVar4 + lVar7);
      }
      lVar12 = lVar12 + lVar9;
      local_88 = local_88 + iVar5;
      lVar10 = lVar10 + lVar9;
      lVar13 = lVar1;
    } while (lVar12 < n);
  }
  return;
}

Assistant:

void cftmdl(int n, int l, double *a, double *w)
{
    int j, j1, j2, j3, k, k1, k2, m, m2;
    double wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;
    
    m = l << 2;
    for (j = 0; j < l; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x0r - x2r;
        a[j2 + 1] = x0i - x2i;
        a[j1] = x1r - x3i;
        a[j1 + 1] = x1i + x3r;
        a[j3] = x1r + x3i;
        a[j3 + 1] = x1i - x3r;
    }
    wk1r = w[2];
    for (j = m; j < l + m; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x2i - x0i;
        a[j2 + 1] = x0r - x2r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j1] = wk1r * (x0r - x0i);
        a[j1 + 1] = wk1r * (x0r + x0i);
        x0r = x3i + x1r;
        x0i = x3r - x1i;
        a[j3] = wk1r * (x0i - x0r);
        a[j3 + 1] = wk1r * (x0i + x0r);
    }
    k1 = 0;
    m2 = 2 * m;
    for (k = m2; k < n; k += m2) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        for (j = k; j < l + k; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = wk2r * x0r - wk2i * x0i;
            a[j2 + 1] = wk2r * x0i + wk2i * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        for (j = k + m; j < l + (k + m); j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = -wk2i * x0r - wk2r * x0i;
            a[j2 + 1] = -wk2i * x0i + wk2r * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
    }
}